

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.cpp
# Opt level: O1

size_t __thiscall axl::sl::Package::append_va(Package *this,Packer *packer,axl_va_list *va)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  size_t size;
  long local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined1 local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  char local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [24];
  char local_30;
  
  local_88 = *(undefined4 *)va;
  uStack_84 = *(undefined4 *)&va->field_0x4;
  uStack_80 = *(undefined4 *)&va->field_0x8;
  uStack_7c = *(undefined4 *)&va->field_0xc;
  local_78 = *(undefined8 *)&va->field_0x10;
  local_70 = '\x01';
  (**packer->_vptr_Packer)(local_48,packer,0,&local_b0,&local_88);
  if (local_30 == '\x01') {
    local_30 = '\0';
  }
  if (local_70 == '\x01') {
    local_70 = '\0';
  }
  sVar3 = *(size_t *)&this->field_0x10;
  bVar1 = Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<unsigned_char>::Construct>
                    (&this->m_buffer,local_b0 + sVar3);
  if (bVar1) {
    bVar1 = Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::ensureExclusive
                      (&this->m_buffer);
    if (bVar1) {
      lVar2 = *(long *)this;
    }
    else {
      lVar2 = 0;
    }
    local_a8 = *(undefined4 *)va;
    uStack_a4 = *(undefined4 *)&va->field_0x4;
    uStack_a0 = *(undefined4 *)&va->field_0x8;
    uStack_9c = *(undefined4 *)&va->field_0xc;
    local_98 = *(undefined8 *)&va->field_0x10;
    local_90 = 1;
    (**packer->_vptr_Packer)(local_68,packer,lVar2 + sVar3,&local_b0,&local_a8);
    sVar3 = local_b0 + sVar3;
  }
  return sVar3;
}

Assistant:

size_t
Package::append_va(
	Packer* packer,
	axl_va_list va
) {
	bool result;

	size_t size;
	packer->pack_va(NULL, &size, va);

	size_t oldSize = m_buffer.getCount();
	size_t newSize = oldSize + size;

	result = m_buffer.setCount(newSize);
	if (!result)
		return oldSize;

	packer->pack_va(m_buffer.p() + oldSize, &size, va);
	return newSize;
}